

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

int Gia_ManCountMinterms(Gia_ManAre_t *p)

{
  Gia_StaAre_t *pCube;
  uint uVar1;
  uint **ppuVar2;
  uint uVar3;
  uint *pStore;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  uVar5 = p->pAig->nRegs;
  iVar6 = -1;
  if ((int)uVar5 < 0x1f) {
    uVar7 = 1;
    uVar3 = ((1 << ((byte)uVar5 & 0x1f)) >> 5) + (uint)(uVar5 < 5);
    pStore = (uint *)calloc((long)(int)uVar3,4);
    uVar1 = p->nStas;
    if (1 < (int)uVar1) {
      ppuVar2 = p->ppStas;
      iVar6 = p->nSize;
      do {
        if (ppuVar2[uVar7 >> 0x14] == (uint *)0x0) break;
        pCube = (Gia_StaAre_t *)(ppuVar2[uVar7 >> 0x14] + (ulong)(uVar7 & 0xfffff) * (long)iVar6);
        if (-1 < (int)pCube->iPrev) {
          Gia_ManCountMintermsInCube(pCube,uVar5,pStore);
        }
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    if ((int)uVar3 < 1) {
      iVar6 = 0;
    }
    else {
      uVar4 = 0;
      iVar6 = 0;
      do {
        uVar5 = (pStore[uVar4] >> 1 & 0x55555555) + (pStore[uVar4] & 0x55555555);
        uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
        uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
        uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
        iVar6 = (uVar5 >> 0x10) + iVar6 + (uVar5 & 0xffff);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    if (pStore != (uint *)0x0) {
      free(pStore);
    }
  }
  return iVar6;
}

Assistant:

int Gia_ManCountMinterms( Gia_ManAre_t * p )
{
    Gia_StaAre_t * pCube;
    unsigned * pMemory;
    int i, nMemSize, Counter = 0;
    if ( Gia_ManRegNum(p->pAig) > 30 )
        return -1;
    nMemSize = Abc_BitWordNum( 1 << Gia_ManRegNum(p->pAig) );
    pMemory  = ABC_CALLOC( unsigned, nMemSize );
    Gia_ManAreForEachCubeStore( p, pCube, i )
        if ( Gia_StaIsUsed(pCube) )
            Gia_ManCountMintermsInCube( pCube, Gia_ManRegNum(p->pAig), pMemory );
    for ( i = 0; i < nMemSize; i++ )
        Counter += Gia_WordCountOnes( pMemory[i] );
    ABC_FREE( pMemory );
    return Counter;
}